

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

CURLcode curlx_base64_decode(char *src,uchar **outptr,size_t *outlen)

{
  size_t sVar1;
  size_t sVar2;
  ulong local_188;
  size_t padc;
  int j_1;
  uint x_1;
  uint uStack_170;
  uchar val_1;
  int j;
  uint x;
  uchar val;
  uchar lookup [256];
  uchar *newstr;
  uchar *pos;
  size_t rawlen;
  size_t fullQuantums;
  size_t numQuantums;
  size_t i;
  size_t padding;
  size_t srclen;
  size_t *outlen_local;
  uchar **outptr_local;
  char *src_local;
  
  i = 0;
  *outptr = (uchar *)0x0;
  *outlen = 0;
  sVar1 = strlen(src);
  if ((sVar1 != 0) && ((sVar1 & 3) == 0)) {
    do {
      if (src[(sVar1 - 1) - i] != '=') {
        sVar2 = (sVar1 >> 2) * 3 - i;
        newstr = (uchar *)malloc(sVar2 + 1);
        if (newstr == (uchar *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        lookup._248_8_ = newstr;
        memset(&x,0xff,0x100);
        memcpy(lookup + 0x23,decodetable,0x50);
        outptr_local = (uchar **)src;
        for (numQuantums = 0; numQuantums < (sVar1 >> 2) - (long)(int)(uint)(i != 0);
            numQuantums = numQuantums + 1) {
          uStack_170 = 0;
          for (x_1 = 0; (int)x_1 < 4; x_1 = x_1 + 1) {
            if (*(byte *)((long)&x + (ulong)*(byte *)outptr_local) == 0xff) goto LAB_0012b32a;
            uStack_170 = uStack_170 << 6 | (uint)*(byte *)((long)&x + (ulong)*(byte *)outptr_local);
            outptr_local = (uchar **)((long)outptr_local + 1);
          }
          newstr[2] = (uchar)uStack_170;
          newstr[1] = (uchar)(uStack_170 >> 8);
          *newstr = (uchar)(uStack_170 >> 0x10);
          newstr = newstr + 3;
        }
        if (i != 0) {
          padc._4_4_ = 0;
          local_188 = 0;
          for (padc._0_4_ = 0; (int)padc < 4; padc._0_4_ = (int)padc + 1) {
            if (*(char *)outptr_local == '=') {
              padc._4_4_ = padc._4_4_ << 6;
              local_188 = local_188 + 1;
              if (i < local_188) {
LAB_0012b32a:
                free((void *)lookup._248_8_);
                return CURLE_BAD_CONTENT_ENCODING;
              }
            }
            else {
              if (*(byte *)((long)&x + (ulong)*(byte *)outptr_local) == 0xff) goto LAB_0012b32a;
              padc._4_4_ = padc._4_4_ << 6 |
                           (uint)*(byte *)((long)&x + (ulong)*(byte *)outptr_local);
            }
            outptr_local = (uchar **)((long)outptr_local + 1);
          }
          if (i == 1) {
            newstr[1] = (uchar)(padc._4_4_ >> 8);
          }
          *newstr = (uchar)(padc._4_4_ >> 0x10);
          newstr = newstr + (3 - i);
        }
        *newstr = '\0';
        *outptr = (uchar *)lookup._248_8_;
        *outlen = sVar2;
        return CURLE_OK;
      }
      i = i + 1;
    } while (i < 3);
  }
  return CURLE_BAD_CONTENT_ENCODING;
}

Assistant:

CURLcode Curl_base64_decode(const char *src,
                            unsigned char **outptr, size_t *outlen)
{
  size_t srclen = 0;
  size_t padding = 0;
  size_t i;
  size_t numQuantums;
  size_t fullQuantums;
  size_t rawlen = 0;
  unsigned char *pos;
  unsigned char *newstr;
  unsigned char lookup[256];

  *outptr = NULL;
  *outlen = 0;
  srclen = strlen(src);

  /* Check the length of the input string is valid */
  if(!srclen || srclen % 4)
    return CURLE_BAD_CONTENT_ENCODING;

  /* srclen is at least 4 here */
  while(src[srclen - 1 - padding] == '=') {
    /* count padding characters */
    padding++;
    /* A maximum of two = padding characters is allowed */
    if(padding > 2)
      return CURLE_BAD_CONTENT_ENCODING;
  }

  /* Calculate the number of quantums */
  numQuantums = srclen / 4;
  fullQuantums = numQuantums - (padding ? 1 : 0);

  /* Calculate the size of the decoded string */
  rawlen = (numQuantums * 3) - padding;

  /* Allocate our buffer including room for a null-terminator */
  newstr = malloc(rawlen + 1);
  if(!newstr)
    return CURLE_OUT_OF_MEMORY;

  pos = newstr;

  memset(lookup, 0xff, sizeof(lookup));
  memcpy(&lookup['+'], decodetable, sizeof(decodetable));
  /* replaces
  {
    unsigned char c;
    const unsigned char *p = (const unsigned char *)base64encdec;
    for(c = 0; *p; c++, p++)
      lookup[*p] = c;
  }
  */

  /* Decode the complete quantums first */
  for(i = 0; i < fullQuantums; i++) {
    unsigned char val;
    unsigned int x = 0;
    int j;

    for(j = 0; j < 4; j++) {
      val = lookup[(unsigned char)*src++];
      if(val == 0xff) /* bad symbol */
        goto bad;
      x = (x << 6) | val;
    }
    pos[2] = x & 0xff;
    pos[1] = (x >> 8) & 0xff;
    pos[0] = (x >> 16) & 0xff;
    pos += 3;
  }
  if(padding) {
    /* this means either 8 or 16 bits output */
    unsigned char val;
    unsigned int x = 0;
    int j;
    size_t padc = 0;
    for(j = 0; j < 4; j++) {
      if(*src == '=') {
        x <<= 6;
        src++;
        if(++padc > padding)
          /* this is a badly placed '=' symbol! */
          goto bad;
      }
      else {
        val = lookup[(unsigned char)*src++];
        if(val == 0xff) /* bad symbol */
          goto bad;
        x = (x << 6) | val;
      }
    }
    if(padding == 1)
      pos[1] = (x >> 8) & 0xff;
    pos[0] = (x >> 16) & 0xff;
    pos += 3 - padding;
  }

  /* Zero terminate */
  *pos = '\0';

  /* Return the decoded data */
  *outptr = newstr;
  *outlen = rawlen;

  return CURLE_OK;
bad:
  free(newstr);
  return CURLE_BAD_CONTENT_ENCODING;
}